

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

int ImParseFormatPrecision(char *fmt,int default_precision)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  char cVar5;
  uint uVar6;
  
  pcVar1 = ImParseFormatFindStart(fmt);
  if (*pcVar1 != '%') {
    return default_precision;
  }
  pcVar1 = pcVar1 + 1;
  do {
    cVar5 = *pcVar1;
    pcVar1 = pcVar1 + 1;
  } while ((byte)(cVar5 - 0x30U) < 10);
  uVar3 = 0x7fffffff;
  if (cVar5 == '.') {
    uVar4 = (ulong)(*pcVar1 == '-');
    pcVar2 = pcVar1 + (pcVar1[uVar4] == '+') + uVar4;
    uVar6 = 0;
    while( true ) {
      cVar5 = *pcVar2;
      if (9 < (byte)(cVar5 - 0x30U)) break;
      pcVar2 = pcVar2 + 1;
      uVar6 = (uint)(byte)(cVar5 - 0x30U) + uVar6 * 10;
    }
    uVar3 = -uVar6;
    if (*pcVar1 != '-') {
      uVar3 = uVar6;
    }
    if (99 < uVar3) {
      uVar3 = default_precision;
    }
  }
  if ((cVar5 != 'E') && (cVar5 != 'e')) {
    if (cVar5 == 'g') {
      if (uVar3 != 0x7fffffff) {
        return uVar3;
      }
    }
    else if ((cVar5 != 'G') || (uVar3 != 0x7fffffff)) {
      if (uVar3 != 0x7fffffff) {
        return uVar3;
      }
      return default_precision;
    }
  }
  return -1;
}

Assistant:

int ImParseFormatPrecision(const char* fmt, int default_precision)
{
    fmt = ImParseFormatFindStart(fmt);
    if (fmt[0] != '%')
        return default_precision;
    fmt++;
    while (*fmt >= '0' && *fmt <= '9')
        fmt++;
    int precision = INT_MAX;
    if (*fmt == '.')
    {
        fmt = ImAtoi<int>(fmt + 1, &precision);
        if (precision < 0 || precision > 99)
            precision = default_precision;
    }
    if (*fmt == 'e' || *fmt == 'E') // Maximum precision with scientific notation
        precision = -1;
    if ((*fmt == 'g' || *fmt == 'G') && precision == INT_MAX)
        precision = -1;
    return (precision == INT_MAX) ? default_precision : precision;
}